

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O0

word Extra_Truth6MinimumRoundMany(word t,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  word wVar1;
  word local_40;
  word tMin;
  word tMin0;
  int bitInfoTemp;
  int i;
  uint *pCanonPhase_local;
  char *pCanonPerm_local;
  int *pStore_local;
  word t_local;
  
  local_40 = t;
  do {
    wVar1 = local_40;
    tMin0._0_4_ = *pStore;
    for (tMin0._4_4_ = 0; tMin0._4_4_ < 5; tMin0._4_4_ = tMin0._4_4_ + 1) {
      if ((int)tMin0 == pStore[tMin0._4_4_ + 1]) {
        local_40 = Extra_Truth6MinimumRoundOne(local_40,tMin0._4_4_,pCanonPerm,pCanonPhase);
      }
      else {
        tMin0._0_4_ = pStore[tMin0._4_4_ + 1];
      }
    }
  } while (wVar1 != local_40);
  return local_40;
}

Assistant:

word Extra_Truth6MinimumRoundMany( word t, int* pStore, char* pCanonPerm, unsigned* pCanonPhase )
{
    int i, bitInfoTemp;
    word tMin0, tMin=t;
    do
    {
        bitInfoTemp = pStore[0];
        tMin0 = tMin;
        for ( i = 0; i < 5; i++ )
        {
            if(bitInfoTemp == pStore[i+1])          
                tMin = Extra_Truth6MinimumRoundOne( tMin, i, pCanonPerm, pCanonPhase );         
            else
                bitInfoTemp = pStore[i+1];
        }
    }while ( tMin0 != tMin );
    return tMin;
}